

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_program.c
# Opt level: O0

ssize_t child_read(archive_read_filter *self,char *buf,size_t buf_len)

{
  int iVar1;
  int *piVar2;
  void *__buf;
  bool bVar3;
  size_t local_58;
  char *p;
  ssize_t avail;
  ssize_t requested;
  ssize_t ret;
  program_filter *state;
  size_t buf_len_local;
  char *buf_local;
  archive_read_filter *self_local;
  
  ret = (ssize_t)self->data;
  local_58 = buf_len;
  if (0x7fffffffffffffff < buf_len) {
    local_58 = 0x7fffffffffffffff;
  }
  avail = local_58;
  state = (program_filter *)buf_len;
  buf_len_local = (size_t)buf;
  buf_local = (char *)self;
  while( true ) {
    do {
      requested = read(*(int *)(ret + 0x28),(void *)buf_len_local,avail);
      bVar3 = false;
      if (requested == -1) {
        piVar2 = __errno_location();
        bVar3 = *piVar2 == 4;
      }
    } while (bVar3);
    if (0 < requested) break;
    if ((requested == 0) || ((requested == -1 && (piVar2 = __errno_location(), *piVar2 == 0x20)))) {
      iVar1 = child_stop((archive_read_filter *)buf_local,(program_filter *)ret);
      return (long)iVar1;
    }
    if ((requested == -1) && (piVar2 = __errno_location(), *piVar2 != 0xb)) {
      return -1;
    }
    if (*(int *)(ret + 0x24) == -1) {
      __archive_check_child(*(int *)(ret + 0x24),*(int *)(ret + 0x28));
    }
    else {
      __buf = __archive_read_filter_ahead
                        (*(archive_read_filter **)(buf_local + 0x10),1,(ssize_t *)&p);
      if (__buf == (void *)0x0) {
        close(*(int *)(ret + 0x24));
        *(undefined4 *)(ret + 0x24) = 0xffffffff;
        fcntl(*(int *)(ret + 0x28),4,0);
        if ((long)p < 0) {
          return (ssize_t)p;
        }
      }
      else {
        do {
          requested = write(*(int *)(ret + 0x24),__buf,(size_t)p);
          bVar3 = false;
          if (requested == -1) {
            piVar2 = __errno_location();
            bVar3 = *piVar2 == 4;
          }
        } while (bVar3);
        if (requested < 1) {
          if ((requested == -1) && (piVar2 = __errno_location(), *piVar2 == 0xb)) {
            __archive_check_child(*(int *)(ret + 0x24),*(int *)(ret + 0x28));
          }
          else {
            close(*(int *)(ret + 0x24));
            *(undefined4 *)(ret + 0x24) = 0xffffffff;
            fcntl(*(int *)(ret + 0x28),4,0);
            if ((requested == -1) && (piVar2 = __errno_location(), *piVar2 != 0x20)) {
              return -1;
            }
          }
        }
        else {
          __archive_read_filter_consume(*(archive_read_filter **)(buf_local + 0x10),requested);
        }
      }
    }
  }
  return requested;
}

Assistant:

static ssize_t
child_read(struct archive_read_filter *self, char *buf, size_t buf_len)
{
	struct program_filter *state = self->data;
	ssize_t ret, requested, avail;
	const char *p;
#if defined(_WIN32) && !defined(__CYGWIN__)
	HANDLE handle = (HANDLE)_get_osfhandle(state->child_stdout);
#endif

	requested = buf_len > SSIZE_MAX ? SSIZE_MAX : buf_len;

	for (;;) {
		do {
#if defined(_WIN32) && !defined(__CYGWIN__)
			/* Avoid infinity wait.
			 * Note: If there is no data in the pipe, ReadFile()
			 * called in read() never returns and so we won't
			 * write remaining encoded data to the pipe.
			 * Note: This way may cause performance problem.
			 * we are looking forward to great code to resolve
			 * this.  */
			DWORD pipe_avail = -1;
			int cnt = 2;

			while (PeekNamedPipe(handle, NULL, 0, NULL,
			    &pipe_avail, NULL) != 0 && pipe_avail == 0 &&
			    cnt--)
				Sleep(5);
			if (pipe_avail == 0) {
				ret = -1;
				errno = EAGAIN;
				break;
			}
#endif
			ret = read(state->child_stdout, buf, requested);
		} while (ret == -1 && errno == EINTR);

		if (ret > 0)
			return (ret);
		if (ret == 0 || (ret == -1 && errno == EPIPE))
			/* Child has closed its output; reap the child
			 * and return the status. */
			return (child_stop(self, state));
		if (ret == -1 && errno != EAGAIN)
			return (-1);

		if (state->child_stdin == -1) {
			/* Block until child has some I/O ready. */
			__archive_check_child(state->child_stdin,
			    state->child_stdout);
			continue;
		}

		/* Get some more data from upstream. */
		p = __archive_read_filter_ahead(self->upstream, 1, &avail);
		if (p == NULL) {
			close(state->child_stdin);
			state->child_stdin = -1;
			fcntl(state->child_stdout, F_SETFL, 0);
			if (avail < 0)
				return (avail);
			continue;
		}

		do {
			ret = write(state->child_stdin, p, avail);
		} while (ret == -1 && errno == EINTR);

		if (ret > 0) {
			/* Consume whatever we managed to write. */
			__archive_read_filter_consume(self->upstream, ret);
		} else if (ret == -1 && errno == EAGAIN) {
			/* Block until child has some I/O ready. */
			__archive_check_child(state->child_stdin,
			    state->child_stdout);
		} else {
			/* Write failed. */
			close(state->child_stdin);
			state->child_stdin = -1;
			fcntl(state->child_stdout, F_SETFL, 0);
			/* If it was a bad error, we're done; otherwise
			 * it was EPIPE or EOF, and we can still read
			 * from the child. */
			if (ret == -1 && errno != EPIPE)
				return (-1);
		}
	}
}